

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Render(void)

{
  ImGuiWindow *window_00;
  ImGuiViewportP *pIVar1;
  bool bVar2;
  ImGuiViewportP **ppIVar3;
  ImGuiWindow **ppIVar4;
  ImDrawData *draw_data;
  ImGuiViewportP *viewport_1;
  int n_3;
  int n_2;
  ImGuiWindow *window;
  int n_1;
  ImGuiWindow *windows_to_render_top_most [2];
  ImGuiViewportP *viewport;
  int n;
  bool first_render_of_frame;
  ImGuiContext *g;
  ImU32 in_stack_0000012c;
  ImU32 in_stack_00000130;
  ImU32 in_stack_00000134;
  ImGuiMouseCursor in_stack_00000138;
  float in_stack_0000013c;
  ImVec2 in_stack_00000140;
  ImDrawList *in_stack_ffffffffffffff78;
  ImGuiWindow *in_stack_ffffffffffffff80;
  ImVector<ImDrawList_*> *out_list;
  ImGuiWindow *local_78;
  ImGuiWindow *local_70;
  ImVector<ImDrawList_*> *in_stack_ffffffffffffff98;
  ImGuiContext *in_stack_ffffffffffffffa0;
  int local_4c;
  int local_3c;
  int local_2c;
  ImGuiWindow *local_28 [2];
  ImGuiViewportP *local_18;
  int local_10;
  byte local_9;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  local_9 = local_8->FrameCountRendered != local_8->FrameCount;
  local_8->FrameCountRendered = local_8->FrameCount;
  (local_8->IO).MetricsRenderWindows = 0;
  CallContextHooks(in_stack_ffffffffffffffa0,
                   (ImGuiContextHookType)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  for (local_10 = 0; local_10 != (local_8->Viewports).Size; local_10 = local_10 + 1) {
    ppIVar3 = ImVector<ImGuiViewportP_*>::operator[](&local_8->Viewports,local_10);
    local_18 = *ppIVar3;
    ImDrawDataBuilder::Clear((ImDrawDataBuilder *)in_stack_ffffffffffffff80);
    if (local_18->DrawLists[0] != (ImDrawList *)0x0) {
      in_stack_ffffffffffffff98 = (local_18->DrawDataBuilder).Layers;
      GetBackgroundDrawList((ImGuiViewport *)0x127e9c);
      AddDrawListToDrawData
                ((ImVector<ImDrawList_*> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  if ((local_9 & 1) != 0) {
    RenderDimmedBackgrounds();
  }
  if ((local_8->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     ((local_8->NavWindowingTarget->Flags & 0x2000U) != 0)) {
    local_70 = (ImGuiWindow *)0x0;
  }
  else {
    local_70 = local_8->NavWindowingTarget->RootWindow;
  }
  local_28[0] = local_70;
  if (local_8->NavWindowingTarget == (ImGuiWindow *)0x0) {
    local_78 = (ImGuiWindow *)0x0;
  }
  else {
    local_78 = local_8->NavWindowingListWindow;
  }
  local_28[1] = local_78;
  for (local_2c = 0; local_2c != (local_8->Windows).Size; local_2c = local_2c + 1) {
    ppIVar4 = ImVector<ImGuiWindow_*>::operator[](&local_8->Windows,local_2c);
    window_00 = *ppIVar4;
    bVar2 = IsWindowActiveAndVisible(window_00);
    if ((((bVar2) && ((window_00->Flags & 0x1000000U) == 0)) && (window_00 != local_28[0])) &&
       (window_00 != local_28[1])) {
      AddRootWindowToDrawData(in_stack_ffffffffffffff80);
    }
  }
  for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
    if ((local_28[local_3c] != (ImGuiWindow *)0x0) &&
       (bVar2 = IsWindowActiveAndVisible(local_28[local_3c]), bVar2)) {
      AddRootWindowToDrawData(in_stack_ffffffffffffff80);
    }
  }
  if (((((local_8->IO).MouseDrawCursor & 1U) != 0) && ((local_9 & 1) != 0)) &&
     (local_8->MouseCursor != -1)) {
    RenderMouseCursor(in_stack_00000140,in_stack_0000013c,in_stack_00000138,in_stack_00000134,
                      in_stack_00000130,in_stack_0000012c);
  }
  (local_8->IO).MetricsRenderIndices = 0;
  (local_8->IO).MetricsRenderVertices = 0;
  for (local_4c = 0; local_4c < (local_8->Viewports).Size; local_4c = local_4c + 1) {
    ppIVar3 = ImVector<ImGuiViewportP_*>::operator[](&local_8->Viewports,local_4c);
    pIVar1 = *ppIVar3;
    ImDrawDataBuilder::FlattenIntoSingleLayer((ImDrawDataBuilder *)in_stack_ffffffffffffffa0);
    if (pIVar1->DrawLists[1] != (ImDrawList *)0x0) {
      out_list = (pIVar1->DrawDataBuilder).Layers;
      GetForegroundDrawList((ImGuiViewport *)0x128141);
      AddDrawListToDrawData(out_list,in_stack_ffffffffffffff78);
    }
    SetupViewportDrawData((ImGuiViewportP *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffa0 = (ImGuiContext *)&pIVar1->DrawDataP;
    (local_8->IO).MetricsRenderVertices =
         (pIVar1->DrawDataP).TotalVtxCount + (local_8->IO).MetricsRenderVertices;
    (local_8->IO).MetricsRenderIndices =
         (pIVar1->DrawDataP).TotalIdxCount + (local_8->IO).MetricsRenderIndices;
  }
  CallContextHooks(in_stack_ffffffffffffffa0,
                   (ImGuiContextHookType)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    const bool first_render_of_frame = (g.FrameCountRendered != g.FrameCount);
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Draw modal/window whitening backgrounds
    if (first_render_of_frame)
        RenderDimmedBackgrounds();

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        IM_MSVC_WARNING_SUPPRESS(6011); // Static Analysis false positive "warning C6011: Dereferencing NULL pointer 'window'"
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Draw software mouse cursor if requested by io.MouseDrawCursor flag
    if (g.IO.MouseDrawCursor && first_render_of_frame && g.MouseCursor != ImGuiMouseCursor_None)
        RenderMouseCursor(g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = &viewport->DrawDataP;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}